

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softhsm2-dump-file.cpp
# Opt level: O0

bool readULong(FILE *stream,uint64_t *value)

{
  int iVar1;
  size_t sVar2;
  long *in_RSI;
  FILE *in_RDI;
  size_t i;
  uint8_t v [8];
  fpos_t pos;
  ulong local_38;
  byte local_30 [8];
  fpos_t local_28;
  long *local_18;
  FILE *local_10;
  bool local_1;
  
  *in_RSI = 0;
  local_18 = in_RSI;
  local_10 = in_RDI;
  iVar1 = fgetpos(in_RDI,&local_28);
  if (iVar1 == 0) {
    sVar2 = fread(local_30,1,8,local_10);
    if (sVar2 == 8) {
      for (local_38 = 0; local_38 < 8; local_38 = local_38 + 1) {
        *local_18 = *local_18 << 8;
        *local_18 = (ulong)local_30[local_38] + *local_18;
      }
      local_1 = true;
    }
    else {
      fsetpos(local_10,&local_28);
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool readULong(FILE* stream, uint64_t& value)
{
	value = 0;
	fpos_t pos;
	if (fgetpos(stream, &pos) != 0)
	{
		return false;
	}
	uint8_t v[8];
	if (fread(v, 1, 8, stream) != 8)
	{
		(void) fsetpos(stream, &pos);
		return false;
	}
	for (size_t i = 0; i < 8; i++)
	{
		value <<= 8;
		value += v[i];
	}
	return true;
}